

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shortest-paths.hxx
# Opt level: O0

bool andres::graph::
     spsp<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>,lineage::ProblemGraph::SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *g,
               SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               *mask,size_t vs,size_t vt,deque<unsigned_long,_std::allocator<unsigned_long>_> *path,
               vector<long,_std::allocator<long>_> *parents)

{
  vector<long,_std::allocator<long>_> *pvVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  pointer pAVar5;
  Value VVar6;
  long lVar7;
  size_type in_RCX;
  size_type in_RDX;
  undefined1 *puVar8;
  vector<long,_std::allocator<long>_> *in_R9;
  AdjacencyIterator end;
  AdjacencyIterator it;
  size_t v;
  size_t n;
  size_t numberOfNodesAtFront;
  size_t q;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> queues [2];
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_fffffffffffffd78;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffd80;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> in_stack_fffffffffffffd88;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> in_stack_fffffffffffffd90;
  undefined1 *puVar9;
  size_type in_stack_fffffffffffffd98;
  deque<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffda0;
  undefined1 *local_170;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  local_138;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  local_130;
  value_type local_128;
  ulong local_120;
  ulong local_118;
  long local_110;
  undefined1 local_f8 [160];
  undefined1 auStack_58 [12];
  undefined4 local_4c;
  long *local_48;
  long *local_40;
  vector<long,_std::allocator<long>_> *local_38;
  size_type local_28;
  size_type local_20;
  byte local_1;
  
  local_38 = in_R9;
  local_28 = in_RCX;
  local_20 = in_RDX;
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::clear(in_stack_fffffffffffffda0);
  bVar2 = lineage::ProblemGraph::
          SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::vertex((SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)in_stack_fffffffffffffd90._M_current,
                   (size_t)in_stack_fffffffffffffd88._M_current);
  if ((bVar2) &&
     (bVar2 = lineage::ProblemGraph::
              SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::vertex((SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)in_stack_fffffffffffffd90._M_current,
                       (size_t)in_stack_fffffffffffffd88._M_current), bVar2)) {
    if (local_20 == local_28) {
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&in_stack_fffffffffffffd80->c,(value_type_conflict *)in_stack_fffffffffffffd78);
      local_1 = 1;
    }
    else {
      Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfVertices
                ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1a6546);
      std::vector<long,_std::allocator<long>_>::resize
                ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffda0,
                 in_stack_fffffffffffffd98);
      local_40 = (long *)std::vector<long,_std::allocator<long>_>::begin
                                   ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd78
                                   );
      local_48 = (long *)std::vector<long,_std::allocator<long>_>::end
                                   ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffd78
                                   );
      local_4c = 0;
      std::fill<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,int>
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                 (int *)in_stack_fffffffffffffd80);
      pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](local_38,local_20);
      *pvVar3 = local_20 + 1;
      pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](local_38,local_28);
      *pvVar3 = -1 - local_28;
      local_170 = local_f8;
      do {
        std::queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
        queue<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
                  (in_stack_fffffffffffffd80);
        local_170 = local_170 + 0x50;
      } while (local_170 != auStack_58);
      std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
                (in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
      std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
                (in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
      local_110 = 0;
      while( true ) {
        local_118 = std::
                    queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::size((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)0x1a66d6);
        for (local_120 = 0; local_120 < local_118; local_120 = local_120 + 1) {
          pvVar4 = std::
                   queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::front((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)0x1a672b);
          local_128 = *pvVar4;
          std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
                    ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)0x1a674f);
          __gnu_cxx::
          __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
          ::__normal_iterator(&local_130);
          __gnu_cxx::
          __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
          ::__normal_iterator(&local_138);
          if (local_110 == 0) {
            local_130._M_current =
                 (Adjacency<unsigned_long> *)
                 Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::adjacenciesFromVertexBegin
                           (in_stack_fffffffffffffd78,0x1a678d);
            local_138._M_current =
                 (Adjacency<unsigned_long> *)
                 Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::adjacenciesFromVertexEnd
                           (in_stack_fffffffffffffd78,0x1a67cc);
          }
          else {
            local_130._M_current =
                 (Adjacency<unsigned_long> *)
                 Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::adjacenciesToVertexBegin
                           (in_stack_fffffffffffffd78,0x1a68b1);
            local_138._M_current =
                 (Adjacency<unsigned_long> *)
                 Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::adjacenciesToVertexEnd
                           (in_stack_fffffffffffffd78,0x1a68f0);
          }
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                                     *)in_stack_fffffffffffffd80,
                                    (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                                     *)in_stack_fffffffffffffd78), bVar2) {
            pAVar5 = __gnu_cxx::
                     __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                     ::operator->(&local_130);
            Adjacency<unsigned_long>::edge(pAVar5);
            bVar2 = lineage::ProblemGraph::
                    SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::edge((SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)in_stack_fffffffffffffd88._M_current,(size_t)in_stack_fffffffffffffd80
                          );
            if (bVar2) {
              pAVar5 = __gnu_cxx::
                       __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                       ::operator->(&local_130);
              Adjacency<unsigned_long>::vertex(pAVar5);
              bVar2 = lineage::ProblemGraph::
                      SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::vertex((SubgraphOfTwoFramesWithoutCut<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)in_stack_fffffffffffffd90._M_current,
                               (size_t)in_stack_fffffffffffffd88._M_current);
              pvVar1 = local_38;
              if (bVar2) {
                pAVar5 = __gnu_cxx::
                         __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                         ::operator->(&local_130);
                VVar6 = Adjacency<unsigned_long>::vertex(pAVar5);
                pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](pvVar1,VVar6);
                pvVar1 = local_38;
                if ((*pvVar3 < 0) && (local_110 == 0)) {
                  pAVar5 = __gnu_cxx::
                           __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                           ::operator->(&local_130);
                  Adjacency<unsigned_long>::vertex(pAVar5);
                  graph_detail::spspHelper<unsigned_long>
                            ((vector<long,_std::allocator<long>_> *)
                             in_stack_fffffffffffffd90._M_current,
                             (unsigned_long)in_stack_fffffffffffffd88._M_current,
                             (unsigned_long)in_stack_fffffffffffffd80,
                             (deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffd78);
                  local_1 = 1;
                  goto LAB_001a6cc9;
                }
                pAVar5 = __gnu_cxx::
                         __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                         ::operator->(&local_130);
                VVar6 = Adjacency<unsigned_long>::vertex(pAVar5);
                pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](pvVar1,VVar6);
                pvVar1 = local_38;
                if ((0 < *pvVar3) && (local_110 == 1)) {
                  pAVar5 = __gnu_cxx::
                           __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                           ::operator->(&local_130);
                  Adjacency<unsigned_long>::vertex(pAVar5);
                  graph_detail::spspHelper<unsigned_long>
                            ((vector<long,_std::allocator<long>_> *)
                             in_stack_fffffffffffffd90._M_current,
                             (unsigned_long)in_stack_fffffffffffffd88._M_current,
                             (unsigned_long)in_stack_fffffffffffffd80,
                             (deque<unsigned_long,_std::allocator<unsigned_long>_> *)
                             in_stack_fffffffffffffd78);
                  local_1 = 1;
                  goto LAB_001a6cc9;
                }
                pAVar5 = __gnu_cxx::
                         __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                         ::operator->(&local_130);
                VVar6 = Adjacency<unsigned_long>::vertex(pAVar5);
                pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](pvVar1,VVar6);
                pvVar1 = local_38;
                if (*pvVar3 == 0) {
                  if (local_110 == 0) {
                    lVar7 = local_128 + 1;
                    pAVar5 = __gnu_cxx::
                             __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                             ::operator->(&local_130);
                    VVar6 = Adjacency<unsigned_long>::vertex(pAVar5);
                    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](pvVar1,VVar6);
                    *pvVar3 = lVar7;
                  }
                  else {
                    lVar7 = -1 - local_128;
                    pAVar5 = __gnu_cxx::
                             __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                             ::operator->(&local_130);
                    VVar6 = Adjacency<unsigned_long>::vertex(pAVar5);
                    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](pvVar1,VVar6);
                    *pvVar3 = lVar7;
                  }
                  pAVar5 = __gnu_cxx::
                           __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                           ::operator->(&local_130);
                  Adjacency<unsigned_long>::vertex(pAVar5);
                  std::
                  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
                  push(in_stack_fffffffffffffd80,(value_type *)in_stack_fffffffffffffd78);
                }
              }
            }
            __gnu_cxx::
            __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
            ::operator++(&local_130);
          }
        }
        bVar2 = std::
                queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
                empty((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                       *)0x1a6c79);
        if ((bVar2) &&
           (bVar2 = std::
                    queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::empty((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)0x1a6c90), bVar2)) break;
        local_110 = 1 - local_110;
      }
      local_1 = 0;
LAB_001a6cc9:
      puVar9 = local_f8;
      puVar8 = auStack_58;
      do {
        puVar8 = puVar8 + -0x50;
        std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
        ~queue((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               0x1a6cf4);
      } while (puVar8 != puVar9);
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool 
spsp(
    const GRAPH& g, 
    const SUBGRAPH_MASK& mask,
    const std::size_t vs,
    const std::size_t vt,
    std::deque<std::size_t>& path,
    std::vector<std::ptrdiff_t>& parents// = std::vector<std::ptrdiff_t>()
) {
    path.clear();
    if(!mask.vertex(vs) || !mask.vertex(vt)) {
        return false;
    }
    if(vs == vt) {
        path.push_back(vs);
        return true;
    }
    parents.resize(g.numberOfVertices());
    std::fill(parents.begin(), parents.end(), 0);
    parents[vs] = vs + 1;
    parents[vt] = -static_cast<std::ptrdiff_t>(vt) - 1;
    std::queue<std::size_t> queues[2];
    queues[0].push(vs);
    queues[1].push(vt);
    for(std::size_t q = 0; true; q = 1 - q) { // infinite loop, alternating queues
        const std::size_t numberOfNodesAtFront = queues[q].size();
        for(std::size_t n = 0; n < numberOfNodesAtFront; ++n) {
            const std::size_t v = queues[q].front();
            queues[q].pop();
            typename GRAPH::AdjacencyIterator it;
            typename GRAPH::AdjacencyIterator end;
            if(q == 0) {
                it = g.adjacenciesFromVertexBegin(v);
                end = g.adjacenciesFromVertexEnd(v);
            }
            else {
                it = g.adjacenciesToVertexBegin(v);
                end = g.adjacenciesToVertexEnd(v);
            }
            for(; it != end; ++it) {
                if(!mask.edge(it->edge()) || !mask.vertex(it->vertex())) {
                    continue;
                }
                if(parents[it->vertex()] < 0 && q == 0) {
                    graph_detail::spspHelper(parents, v, it->vertex(), path);
                    assert(path[0] == vs);
                    assert(path.back() == vt);
                    return true;
                }
                else if(parents[it->vertex()] > 0 && q == 1) {
                    graph_detail::spspHelper(parents, it->vertex(), v, path);
                    assert(path[0] == vs);
                    assert(path.back() == vt);
                    return true;
                }
                else if(parents[it->vertex()] == 0) {
                    if(q == 0) {
                        parents[it->vertex()] = v + 1;
                    }
                    else {
                        parents[it->vertex()] = -static_cast<std::ptrdiff_t>(v) - 1;
                    }
                    queues[q].push(it->vertex());
                }
            }
        }
        if(queues[0].empty() && queues[1].empty()) {
            return false;
        }
    }
}